

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToFloat64Free(JSContext *ctx,double *pres,JSValue val)

{
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  if ((uint)val.tag < 3) {
    *pres = (double)val.u._0_4_;
  }
  else {
    if ((uint)val.tag != 7) {
      JVar4 = JS_ToNumberFree(ctx,val);
      JVar3 = JVar4.u;
      iVar2 = (int)JVar4.tag;
      if (iVar2 == 6) {
        iVar1 = -1;
        JVar3.float64 = NAN;
      }
      else {
        iVar1 = 0;
        if (iVar2 != 7) {
          if (iVar2 != 0) {
            abort();
          }
          JVar3.float64 = (double)JVar4.u._0_4_;
        }
      }
      *pres = (double)JVar3;
      return iVar1;
    }
    *pres = (double)val.u;
  }
  return 0;
}

Assistant:

static inline int JS_ToFloat64Free(JSContext *ctx, double *pres, JSValue val)
{
    uint32_t tag;

    tag = JS_VALUE_GET_TAG(val);
    if (tag <= JS_TAG_NULL) {
        *pres = JS_VALUE_GET_INT(val);
        return 0;
    } else if (JS_TAG_IS_FLOAT64(tag)) {
        *pres = JS_VALUE_GET_FLOAT64(val);
        return 0;
    } else {
        return __JS_ToFloat64Free(ctx, pres, val);
    }
}